

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayUpdate(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *this_00;
  ulong uVar1;
  int iVar2;
  reference pvVar3;
  TableCatalogEntry *pTVar4;
  ColumnList *pCVar5;
  TableCatalogEntry *pTVar6;
  undefined4 extraout_var;
  InternalException *pIVar7;
  allocator local_d9;
  vector<unsigned_long,_true> column_path;
  DataChunk chunk;
  type row_ids;
  
  this_00 = &this->deserializer;
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (&column_path,&this_00->super_Deserializer,0x65,"column_indexes");
  DataChunk::DataChunk(&chunk);
  (*(this_00->super_Deserializer)._vptr_Deserializer[2])(this_00,0x66,"chunk");
  (*(this_00->super_Deserializer)._vptr_Deserializer[6])(this_00);
  DataChunk::Deserialize(&chunk,&this_00->super_Deserializer);
  (*(this_00->super_Deserializer)._vptr_Deserializer[7])(this_00);
  (*(this_00->super_Deserializer)._vptr_Deserializer[3])(this_00);
  if (this->deserialize_only == false) {
    if ((this->state->current_table).ptr == (TableCatalogEntry *)0x0) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&row_ids,"Corrupt WAL: update without table",&local_d9);
      InternalException::InternalException(pIVar7,(string *)&row_ids);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar3 = vector<unsigned_long,_true>::get<true>(&column_path,0);
    uVar1 = *pvVar3;
    pTVar4 = optional_ptr<duckdb::TableCatalogEntry,_true>::operator->(&this->state->current_table);
    pCVar5 = TableCatalogEntry::GetColumns(pTVar4);
    if ((ulong)((long)(pCVar5->physical_columns).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pCVar5->physical_columns).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar1) {
      pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&row_ids,"Corrupt WAL: column index for update out of bounds",&local_d9);
      InternalException::InternalException(pIVar7,(string *)&row_ids);
      __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pTVar4 = (TableCatalogEntry *)vector<duckdb::Vector,_true>::back(&chunk.data);
    Vector::Vector(&row_ids,(Vector *)pTVar4);
    chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_finish =
         chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    Vector::~Vector(chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    pTVar6 = optional_ptr<duckdb::TableCatalogEntry,_true>::operator->(&this->state->current_table);
    iVar2 = (*(pTVar6->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0x10])(pTVar6);
    optional_ptr<duckdb::TableCatalogEntry,_true>::operator*(&this->state->current_table);
    DataTable::UpdateColumn
              ((DataTable *)CONCAT44(extraout_var,iVar2),pTVar4,this->context,&row_ids,&column_path,
               &chunk);
    Vector::~Vector(&row_ids);
  }
  DataChunk::~DataChunk(&chunk);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_path);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayUpdate() {
	auto column_path = deserializer.ReadProperty<vector<column_t>>(101, "column_indexes");

	DataChunk chunk;
	deserializer.ReadObject(102, "chunk", [&](Deserializer &object) { chunk.Deserialize(object); });

	if (DeserializeOnly()) {
		return;
	}
	if (!state.current_table) {
		throw InternalException("Corrupt WAL: update without table");
	}

	if (column_path[0] >= state.current_table->GetColumns().PhysicalColumnCount()) {
		throw InternalException("Corrupt WAL: column index for update out of bounds");
	}

	// remove the row id vector from the chunk
	auto row_ids = std::move(chunk.data.back());
	chunk.data.pop_back();

	// now perform the update
	state.current_table->GetStorage().UpdateColumn(*state.current_table, context, row_ids, column_path, chunk);
}